

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::MergeFrom
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  bool is_soo_00;
  bool is_soo_01;
  int n;
  int iVar1;
  RepeatedField<unsigned_int> **v1;
  RepeatedField<unsigned_int> **v2;
  LogMessage *pLVar2;
  uint *puVar3;
  uint *src;
  undefined1 auVar4 [16];
  uint *dst;
  bool is_soo;
  int old_size;
  int other_size;
  bool other_is_soo;
  LogMessageFatal local_48 [23];
  Voidify local_31;
  RepeatedField<unsigned_int> *local_30;
  RepeatedField<unsigned_int> *local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  RepeatedField<unsigned_int> *other_local;
  RepeatedField<unsigned_int> *this_local;
  
  local_28 = other;
  absl_log_internal_check_op_result = (string *)other;
  other_local = this;
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::RepeatedField<unsigned_int>const*>(&local_28);
  local_30 = this;
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::RepeatedField<unsigned_int>*>(&local_30);
  local_20 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::RepeatedField<unsigned_int>const*,google::protobuf::RepeatedField<unsigned_int>*>
                       (v1,v2,"&other != this");
  if (local_20 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x3e1,auVar4._0_8_,auVar4._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  is_soo_00 = RepeatedField<unsigned_int>::is_soo
                        ((RepeatedField<unsigned_int> *)absl_log_internal_check_op_result);
  n = size((RepeatedField<unsigned_int> *)absl_log_internal_check_op_result,is_soo_00);
  if (n != 0) {
    iVar1 = size(this);
    Reserve(this,iVar1 + n);
    is_soo_01 = RepeatedField<unsigned_int>::is_soo(this);
    puVar3 = elements(this,is_soo_01);
    iVar1 = ExchangeCurrentSize(this,is_soo_01,iVar1 + n);
    src = elements((RepeatedField<unsigned_int> *)absl_log_internal_check_op_result,is_soo_00);
    UninitializedCopyN(src,n,puVar3 + iVar1);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  ABSL_DCHECK_NE(&other, this);
  const bool other_is_soo = other.is_soo();
  if (auto other_size = other.size(other_is_soo)) {
    const int old_size = size();
    Reserve(old_size + other_size);
    const bool is_soo = this->is_soo();
    Element* dst =
        elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + other_size);
    UninitializedCopyN(other.elements(other_is_soo), other_size, dst);
  }
}